

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O3

void __thiscall Coin::Clear(Coin *this)

{
  CScript *this_00;
  uint uVar1;
  long lVar2;
  size_type new_capacity;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->out).nValue = -1;
  this_00 = &(this->out).scriptPubKey;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&this_00->super_CScriptBase,0);
  uVar1 = (this->out).scriptPubKey.super_CScriptBase._size;
  new_capacity = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    new_capacity = uVar1;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            (&this_00->super_CScriptBase,new_capacity);
  *(undefined4 *)&this->field_0x28 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Clear() {
        out.SetNull();
        fCoinBase = false;
        nHeight = 0;
    }